

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varlist.cc
# Opt level: O1

void __thiscall VariableList::InitFunctions(VariableList *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  paVar1 = &local_30.field_2;
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ABS","");
  InitOneFunction(this,&local_30,"fabs",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ABS%","");
  InitOneFunction(this,&local_30,"abs",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ASC","");
  InitOneFunction(this,&local_30,"basic::Ascii",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ASCII","");
  InitOneFunction(this,&local_30,"basic::Ascii",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ATN","");
  InitOneFunction(this,&local_30,"atan",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"BUFSIZ","");
  InitOneFunction(this,&local_30,"basic::Bufsiz",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CCPOS","");
  InitOneFunction(this,&local_30,"basic::Ccpos",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CHR$","");
  InitOneFunction(this,&local_30,"basic::Char",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"COMP%","");
  InitOneFunction(this,&local_30,"basic::Comp",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"COS","");
  InitOneFunction(this,&local_30,"cos",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CTRLC","");
  InitOneFunction(this,&local_30,"basic::ctrlc()",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CVT$%","");
  InitOneFunction(this,&local_30,"basic::cvtai",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CVT%$","");
  InitOneFunction(this,&local_30,"basic::cvtia",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CVT$F","");
  InitOneFunction(this,&local_30,"basic::cvtaf",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CVTF$","");
  InitOneFunction(this,&local_30,"basic::cvtfa",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"CVT$$","");
  InitOneFunction(this,&local_30,"basic::edit",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"DATE$","");
  InitOneFunction(this,&local_30,"basic::Qdate",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"DET","");
  InitOneFunction(this,&local_30,"basic::det()",VARTYPE_DOUBLE,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"DIF$","");
  InitOneFunction(this,&local_30,"basic::Dif",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ECHO","");
  InitOneFunction(this,&local_30,"basic::Echo",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"EDIT$","");
  InitOneFunction(this,&local_30,"basic::edit",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ERR","");
  InitOneFunction(this,&local_30,"Be.err",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ERL","");
  InitOneFunction(this,&local_30,"Be.erl",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ERN$","");
  InitOneFunction(this,&local_30,"Be.ern",VARTYPE_DYNSTR,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ERT$","");
  InitOneFunction(this,&local_30,"basic::ert",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"EXP","");
  InitOneFunction(this,&local_30,"basic::exp",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"FIX","");
  InitOneFunction(this,&local_30,"trunc",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"FORMAT$","");
  InitOneFunction(this,&local_30,"basic::Format",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"FSP$","");
  InitOneFunction(this,&local_30,"basic::Fsp",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"FSS$","");
  InitOneFunction(this,&local_30,"basic::Fss",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"GETRFA","");
  InitOneFunction(this,&local_30,"basic::Getrfa",VARTYPE_RFA,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"INKEY$","");
  InitOneFunction(this,&local_30,"basic::Inkey",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"INSTR","");
  InitOneFunction(this,&local_30,"basic::instr",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"INT","");
  InitOneFunction(this,&local_30,"floor",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LEFT","");
  InitOneFunction(this,&local_30,"basic::left",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LEFT$","");
  InitOneFunction(this,&local_30,"basic::left",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LEN","");
  InitOneFunction(this,&local_30,"basic::strlen",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LOC","");
  InitOneFunction(this,&local_30,"&",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LOG","");
  InitOneFunction(this,&local_30,"log",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LOG10","");
  InitOneFunction(this,&local_30,"log10",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"MAG","");
  InitOneFunction(this,&local_30,"basic::Mag",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"MAGTAPE","");
  InitOneFunction(this,&local_30,"basic::Magtape",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"MAR","");
  InitOneFunction(this,&local_30,"basic::Mar",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"MID","");
  InitOneFunction(this,&local_30,"basic::mid",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"MID$","");
  InitOneFunction(this,&local_30,"basic::mid",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NOECHO","");
  InitOneFunction(this,&local_30,"basic::NoEcho",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NUM","");
  InitOneFunction(this,&local_30,"basic::num()",VARTYPE_DOUBLE,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NUM2","");
  InitOneFunction(this,&local_30,"basic::num2()",VARTYPE_DOUBLE,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NUM$","");
  InitOneFunction(this,&local_30,"basic::Qnum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"NUM1$","");
  InitOneFunction(this,&local_30,"std::to_string",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"ONECHR","");
  InitOneFunction(this,&local_30,"basic::OneChr",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"PLACE$","");
  InitOneFunction(this,&local_30,"basic::Place",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"POS","");
  InitOneFunction(this,&local_30,"basic::Ccpos",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"PROD$","");
  InitOneFunction(this,&local_30,"basic::Prod",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"QUO$","");
  InitOneFunction(this,&local_30,"basic::Quo",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RAD$","");
  InitOneFunction(this,&local_30,"basic::Qrad",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RCTLC","");
  InitOneFunction(this,&local_30,"basic::rctlc()",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RCTLO","");
  InitOneFunction(this,&local_30,"basic::rctlo()",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RECOUNT","");
  InitOneFunction(this,&local_30,"basic::recount()",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RIGHT","");
  InitOneFunction(this,&local_30,"basic::right",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RIGHT$","");
  InitOneFunction(this,&local_30,"basic::right",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RND","");
  InitOneFunction(this,&local_30,"basic::floatrand",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"RND","");
  InitOneFunction(this,&local_30,"basic::floatrand()",VARTYPE_DOUBLE,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SEG$","");
  InitOneFunction(this,&local_30,"basic::Qseg",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SGN","");
  InitOneFunction(this,&local_30,"basic::sgn",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SIN","");
  InitOneFunction(this,&local_30,"sin",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SPACE$","");
  InitOneFunction(this,&local_30,"basic::Qspace",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SQRT","");
  InitOneFunction(this,&local_30,"sqrt",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SQR","");
  InitOneFunction(this,&local_30,"sqrt",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"STATUS","");
  InitOneFunction(this,&local_30,"basic::status()",VARTYPE_LONG,VARCLASS_NONE);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"STR$","");
  InitOneFunction(this,&local_30,"basic::Qnum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"STRING$","");
  InitOneFunction(this,&local_30,"basic::Qstring",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"STR$FIND_FIRST_IN_SET","");
  InitOneFunction(this,&local_30,"str$find_first_in_set",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SUM$","");
  InitOneFunction(this,&local_30,"basic::Sum",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SWAP%","");
  InitOneFunction(this,&local_30,"basic::Swap",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"SYS","");
  InitOneFunction(this,&local_30,"basic::sys",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"TAB","");
  InitOneFunction(this,&local_30,"Tab",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"TAN","");
  InitOneFunction(this,&local_30,"tan",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"TIME","");
  InitOneFunction(this,&local_30,"basic::Time",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"TIME$","");
  InitOneFunction(this,&local_30,"basic::Qtime",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"TRM$","");
  InitOneFunction(this,&local_30,"boost::trim_right_copy",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"VAL","");
  InitOneFunction(this,&local_30,"std::stod",VARTYPE_DOUBLE,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"VAL%","");
  InitOneFunction(this,&local_30,"std::stol",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"XLATE","");
  InitOneFunction(this,&local_30,"basic::Xlate",VARTYPE_DYNSTR,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  local_30._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"LIB$SIGNAL","");
  InitOneFunction(this,&local_30,"exit",VARTYPE_LONG,VARCLASS_FUNC);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != paVar1) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VariableList::InitFunctions(void)
{
	InitOneFunction("ABS",		"fabs",			VARTYPE_DOUBLE);
	InitOneFunction("ABS%",		"abs",			VARTYPE_DOUBLE);
	InitOneFunction("ASC",		"basic::Ascii",		VARTYPE_LONG);
	InitOneFunction("ASCII",	"basic::Ascii",		VARTYPE_LONG);
	InitOneFunction("ATN",		"atan",			VARTYPE_DOUBLE);
	InitOneFunction("BUFSIZ",	"basic::Bufsiz",	VARTYPE_LONG);
	InitOneFunction("CCPOS",	"basic::Ccpos",		VARTYPE_LONG);
	InitOneFunction("CHR$",		"basic::Char",		VARTYPE_DYNSTR);
	InitOneFunction("COMP%",	"basic::Comp",		VARTYPE_LONG);
	InitOneFunction("COS",		"cos",			VARTYPE_DOUBLE);
	InitOneFunction("CTRLC",	"basic::ctrlc()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("CVT$%",	"basic::cvtai",		VARTYPE_LONG);
	InitOneFunction("CVT%$",	"basic::cvtia",		VARTYPE_DYNSTR);
	InitOneFunction("CVT$F",	"basic::cvtaf",		VARTYPE_DOUBLE);
	InitOneFunction("CVTF$",	"basic::cvtfa",		VARTYPE_DYNSTR);
	InitOneFunction("CVT$$",	"basic::edit",		VARTYPE_DYNSTR);
	InitOneFunction("DATE$",	"basic::Qdate",		VARTYPE_DYNSTR);
	InitOneFunction("DET",		"basic::det()",		VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("DIF$",		"basic::Dif",		VARTYPE_DYNSTR);
	InitOneFunction("ECHO",		"basic::Echo",		VARTYPE_LONG);
	InitOneFunction("EDIT$",	"basic::edit",		VARTYPE_DYNSTR);
	InitOneFunction("ERR",		"Be.err",		VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("ERL",		"Be.erl",		VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("ERN$",		"Be.ern",		VARTYPE_DYNSTR, VARCLASS_NONE);
	InitOneFunction("ERT$",		"basic::ert",		VARTYPE_DYNSTR);
	InitOneFunction("EXP",		"basic::exp",		VARTYPE_DOUBLE);
	InitOneFunction("FIX",		"trunc",		VARTYPE_DOUBLE);
	InitOneFunction("FORMAT$",	"basic::Format",	VARTYPE_DYNSTR);
	InitOneFunction("FSP$",		"basic::Fsp",		VARTYPE_DYNSTR);
	InitOneFunction("FSS$",		"basic::Fss",		VARTYPE_DYNSTR);
	InitOneFunction("GETRFA",	"basic::Getrfa",	VARTYPE_RFA);
	InitOneFunction("INKEY$",	"basic::Inkey",		VARTYPE_DYNSTR);
	InitOneFunction("INSTR",	"basic::instr",		VARTYPE_LONG);
	InitOneFunction("INT",		"floor",		VARTYPE_DOUBLE);
	InitOneFunction("LEFT",		"basic::left",		VARTYPE_DYNSTR);
	InitOneFunction("LEFT$",	"basic::left",		VARTYPE_DYNSTR);
	InitOneFunction("LEN",		"basic::strlen",	VARTYPE_LONG);
	InitOneFunction("LOC",		"&",			VARTYPE_LONG);
	InitOneFunction("LOG",		"log",			VARTYPE_DOUBLE);
	InitOneFunction("LOG10",	"log10",		VARTYPE_DOUBLE);
	InitOneFunction("MAG",		"basic::Mag",		VARTYPE_DOUBLE);
	InitOneFunction("MAGTAPE",	"basic::Magtape",	VARTYPE_LONG);
	InitOneFunction("MAR",		"basic::Mar",		VARTYPE_LONG);
	InitOneFunction("MID",		"basic::mid",		VARTYPE_DYNSTR);
	InitOneFunction("MID$",		"basic::mid",		VARTYPE_DYNSTR);
	InitOneFunction("NOECHO",	"basic::NoEcho",	VARTYPE_LONG);
	InitOneFunction("NUM",		"basic::num()",		VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("NUM2",		"basic::num2()",	VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("NUM$",		"basic::Qnum",		VARTYPE_DYNSTR);
	InitOneFunction("NUM1$",	"std::to_string",	VARTYPE_DYNSTR);
	InitOneFunction("ONECHR",	"basic::OneChr",	VARTYPE_LONG);
	InitOneFunction("PLACE$",	"basic::Place",		VARTYPE_DYNSTR);
	InitOneFunction("POS",		"basic::Ccpos",		VARTYPE_LONG);
	InitOneFunction("PROD$",	"basic::Prod",		VARTYPE_DYNSTR);
	InitOneFunction("QUO$",		"basic::Quo",		VARTYPE_DYNSTR);
	InitOneFunction("RAD$",		"basic::Qrad",		VARTYPE_DYNSTR);
	InitOneFunction("RCTLC",	"basic::rctlc()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RCTLO",	"basic::rctlo()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RECOUNT",	"basic::recount()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("RIGHT",	"basic::right",		VARTYPE_DYNSTR);
	InitOneFunction("RIGHT$",	"basic::right",		VARTYPE_DYNSTR);
	InitOneFunction("RND",		"basic::floatrand",	VARTYPE_DOUBLE);
	InitOneFunction("RND",		"basic::floatrand()",	VARTYPE_DOUBLE, VARCLASS_NONE);
	InitOneFunction("SEG$",		"basic::Qseg",		VARTYPE_DYNSTR);
	InitOneFunction("SGN",		"basic::sgn",		VARTYPE_LONG);
	InitOneFunction("SIN",		"sin",			VARTYPE_DOUBLE);
	InitOneFunction("SPACE$",	"basic::Qspace",	VARTYPE_DYNSTR);
	InitOneFunction("SQRT",		"sqrt",			VARTYPE_DOUBLE);
	InitOneFunction("SQR",		"sqrt",			VARTYPE_DOUBLE);
	InitOneFunction("STATUS",	"basic::status()",	VARTYPE_LONG, VARCLASS_NONE);
	InitOneFunction("STR$",		"basic::Qnum",		VARTYPE_DYNSTR);
	InitOneFunction("STRING$",	"basic::Qstring",	VARTYPE_DYNSTR);
	InitOneFunction("STR$FIND_FIRST_IN_SET",
					"str$find_first_in_set",VARTYPE_DYNSTR);
	InitOneFunction("SUM$",		"basic::Sum",		VARTYPE_DYNSTR);
	InitOneFunction("SWAP%",	"basic::Swap",		VARTYPE_LONG);
	InitOneFunction("SYS",		"basic::sys",		VARTYPE_DYNSTR);
	InitOneFunction("TAB",		"Tab",			VARTYPE_DYNSTR);
	InitOneFunction("TAN",		"tan",			VARTYPE_DOUBLE);
	InitOneFunction("TIME",		"basic::Time",		VARTYPE_DOUBLE);
	InitOneFunction("TIME$",	"basic::Qtime",		VARTYPE_DYNSTR);
	InitOneFunction("TRM$",		"boost::trim_right_copy",	VARTYPE_DYNSTR);
	InitOneFunction("VAL",		"std::stod",		VARTYPE_DOUBLE);
	InitOneFunction("VAL%",		"std::stol",		VARTYPE_LONG);
	InitOneFunction("XLATE",	"basic::Xlate",		VARTYPE_DYNSTR);
	InitOneFunction("LIB$SIGNAL",	"exit",			VARTYPE_LONG);
}